

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

SstStatusValue SstWaitForCompletion(SstStream Stream,void *handle)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  SstStatusValue local_4;
  
  if (*(int *)(*(long *)(in_RDI + 0x120) + 0x8c) == 0) {
    iVar1 = (**(code **)(*(long *)(in_RDI + 0xb0) + 0x48))(&Svcs,in_RSI);
    if (iVar1 == 1) {
      local_4 = SstSuccess;
    }
    else {
      local_4 = SstFatalError;
    }
  }
  else {
    local_4 = SstSuccess;
  }
  return local_4;
}

Assistant:

extern SstStatusValue SstWaitForCompletion(SstStream Stream, void *handle)
{
    if (Stream->ConfigParams->ReaderShortCircuitReads)
        return SstSuccess;
    if (Stream->DP_Interface->waitForCompletion(&Svcs, handle) != 1)
    {
        return SstFatalError;
    }
    else
    {
        return SstSuccess;
    }
}